

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Patch
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType l,SizeType s)

{
  SizeType SVar1;
  State *pSVar2;
  SizeType next;
  SizeType s_local;
  SizeType l_local;
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  next = l;
  while (next != 0xffffffff) {
    pSVar2 = GetState(this,next);
    SVar1 = pSVar2->out;
    pSVar2 = GetState(this,next);
    pSVar2->out = s;
    next = SVar1;
  }
  return;
}

Assistant:

void Patch(SizeType l, SizeType s) {
        for (SizeType next; l != kRegexInvalidState; l = next) {
            next = GetState(l).out;
            GetState(l).out = s;
        }
    }